

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_keypair_add(void)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  void *pvVar2;
  secp256k1_context *psVar3;
  int iVar4;
  int pk_parity;
  uchar sk32 [32];
  uchar pk32 [32];
  secp256k1_pubkey output_pk_expected;
  secp256k1_pubkey output_pk_xy;
  secp256k1_xonly_pubkey output_pk;
  secp256k1_xonly_pubkey internal_pk;
  secp256k1_callback _saved_callback_4;
  int32_t _calls_to_callback_4;
  secp256k1_callback _saved_callback_3;
  int32_t _calls_to_callback_3;
  secp256k1_callback _saved_callback_2;
  int32_t _calls_to_callback_2;
  secp256k1_keypair keypair_tmp;
  secp256k1_scalar scalar_tweak;
  secp256k1_callback _saved_callback_1;
  int32_t _calls_to_callback_1;
  secp256k1_callback _saved_callback;
  int32_t _calls_to_callback;
  int i;
  uchar tweak [32];
  uchar zeros96 [96];
  uchar overflows [32];
  secp256k1_keypair keypair;
  uchar sk [32];
  secp256k1_scalar *in_stack_fffffffffffffc88;
  undefined2 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc92;
  undefined1 in_stack_fffffffffffffc93;
  undefined4 in_stack_fffffffffffffc94;
  secp256k1_scalar *in_stack_fffffffffffffc98;
  secp256k1_scalar *in_stack_fffffffffffffca0;
  uchar *in_stack_fffffffffffffd08;
  secp256k1_keypair *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined1 local_1d8 [128];
  _func_void_char_ptr_void_ptr *local_158;
  void *local_150;
  int local_144;
  _func_void_char_ptr_void_ptr *local_140;
  void *local_138;
  int local_130;
  int local_12c;
  undefined1 local_108 [96];
  undefined1 local_a8 [32];
  undefined1 local_88 [136];
  
  memset(local_108,0,0x60);
  testrand256((uchar *)CONCAT44(in_stack_fffffffffffffc94,
                                CONCAT13(in_stack_fffffffffffffc93,
                                         CONCAT12(in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90))));
  testrand256((uchar *)CONCAT44(in_stack_fffffffffffffc94,
                                CONCAT13(in_stack_fffffffffffffc93,
                                         CONCAT12(in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90))));
  memset(local_a8,0xff,0x20);
  iVar4 = secp256k1_keypair_create
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x183,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
    abort();
  }
  iVar4 = secp256k1_keypair_xonly_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x185,
            "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1");
    abort();
  }
  iVar4 = secp256k1_keypair_xonly_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x186,
            "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1");
    abort();
  }
  iVar4 = secp256k1_keypair_xonly_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  if (iVar4 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x187,
            "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1");
    abort();
  }
  local_130 = 0;
  local_140 = (CTX->illegal_callback).fn;
  local_138 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)
             CONCAT44(in_stack_fffffffffffffc94,
                      CONCAT13(in_stack_fffffffffffffc93,
                               CONCAT12(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90))),
             (_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffc88,(void *)0x1525c5);
  iVar4 = secp256k1_keypair_xonly_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  psVar3 = CTX;
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x188,
            "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, ((void*)0), tweak)) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_140;
  (psVar3->illegal_callback).data = local_138;
  if (local_130 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x188,"test condition failed: _calls_to_callback == 1");
    abort();
  }
  local_144 = 0;
  local_158 = (CTX->illegal_callback).fn;
  local_150 = (CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)
             CONCAT44(in_stack_fffffffffffffc94,
                      CONCAT13(in_stack_fffffffffffffc93,
                               CONCAT12(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90))),
             (_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffc88,(void *)0x1526e8);
  iVar4 = secp256k1_keypair_xonly_tweak_add
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                     in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  psVar3 = CTX;
  if (iVar4 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x189,
            "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, ((void*)0))) == 0"
           );
    abort();
  }
  (CTX->illegal_callback).fn = local_158;
  (psVar3->illegal_callback).data = local_150;
  if (local_144 == 1) {
    iVar4 = secp256k1_memcmp_var(local_88,local_108,0x60);
    if (iVar4 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
              ,0x18b,
              "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) != 0"
             );
      abort();
    }
    iVar4 = secp256k1_keypair_create
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    if (iVar4 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
              ,0x18e,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
      abort();
    }
    iVar4 = secp256k1_keypair_xonly_tweak_add
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    if (iVar4 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
              ,399,
              "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, overflows) == 0"
             );
      abort();
    }
    iVar4 = secp256k1_memcmp_var(local_88,local_108,0x60);
    if (iVar4 == 0) {
      iVar4 = secp256k1_keypair_create
                        ((secp256k1_context *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                         in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      if (iVar4 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                ,0x193,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1");
        abort();
      }
      iVar4 = secp256k1_keypair_xonly_tweak_add
                        ((secp256k1_context *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                         in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      if (iVar4 == 1) {
        local_12c = 0;
        while( true ) {
          if (COUNT <= local_12c) {
            memset(local_88,0,0x60);
            testrand256((uchar *)CONCAT44(in_stack_fffffffffffffc94,
                                          CONCAT13(in_stack_fffffffffffffc93,
                                                   CONCAT12(in_stack_fffffffffffffc92,
                                                            in_stack_fffffffffffffc90))));
            p_Var1 = (CTX->illegal_callback).fn;
            pvVar2 = (CTX->illegal_callback).data;
            secp256k1_context_set_illegal_callback
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffc94,
                                CONCAT13(in_stack_fffffffffffffc93,
                                         CONCAT12(in_stack_fffffffffffffc92,
                                                  in_stack_fffffffffffffc90))),
                       (_func_void_char_ptr_void_ptr *)in_stack_fffffffffffffc88,(void *)0x152cba);
            iVar4 = secp256k1_keypair_xonly_tweak_add
                              ((secp256k1_context *)
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                               in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
            psVar3 = CTX;
            if (iVar4 == 0) {
              (CTX->illegal_callback).fn = p_Var1;
              (psVar3->illegal_callback).data = pvVar2;
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                      ,0x1ab,"test condition failed: _calls_to_callback == 1");
              abort();
            }
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                    ,0x1ab,
                    "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak)) == 0"
                   );
            abort();
          }
          testrand256((uchar *)CONCAT44(in_stack_fffffffffffffc94,
                                        CONCAT13(in_stack_fffffffffffffc93,
                                                 CONCAT12(in_stack_fffffffffffffc92,
                                                          in_stack_fffffffffffffc90))));
          iVar4 = secp256k1_keypair_create
                            ((secp256k1_context *)
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                             in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          if (iVar4 != 1) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                    ,0x19b,"test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                   );
            abort();
          }
          memcpy(local_1d8,local_88,0x60);
          secp256k1_scalar_set_b32
                    (in_stack_fffffffffffffca0,(uchar *)in_stack_fffffffffffffc98,
                     (int *)CONCAT44(in_stack_fffffffffffffc94,
                                     CONCAT13(in_stack_fffffffffffffc93,
                                              CONCAT12(in_stack_fffffffffffffc92,
                                                       in_stack_fffffffffffffc90))));
          secp256k1_scalar_negate(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
          secp256k1_scalar_get_b32
                    ((uchar *)CONCAT44(in_stack_fffffffffffffc94,
                                       CONCAT13(in_stack_fffffffffffffc93,
                                                CONCAT12(in_stack_fffffffffffffc92,
                                                         in_stack_fffffffffffffc90))),
                     in_stack_fffffffffffffc88);
          iVar4 = secp256k1_keypair_xonly_tweak_add
                            ((secp256k1_context *)
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                             in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          in_stack_fffffffffffffc93 = true;
          if (iVar4 != 0) {
            iVar4 = secp256k1_keypair_xonly_tweak_add
                              ((secp256k1_context *)
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                               in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
            in_stack_fffffffffffffc93 = iVar4 == 0;
          }
          if (((in_stack_fffffffffffffc93 ^ 0xff) & 1) != 0) break;
          iVar4 = secp256k1_memcmp_var(local_88,local_108,0x60);
          in_stack_fffffffffffffc92 = true;
          if (iVar4 != 0) {
            iVar4 = secp256k1_memcmp_var(local_1d8,local_108,0x60);
            in_stack_fffffffffffffc92 = iVar4 == 0;
          }
          if (((in_stack_fffffffffffffc92 ^ 0xff) & 1) != 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                    ,0x1a5,
                    "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0 || secp256k1_memcmp_var(&keypair_tmp, zeros96, sizeof(keypair_tmp)) == 0"
                   );
            abort();
          }
          local_12c = local_12c + 1;
        }
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                ,0x1a3,
                "test condition failed: (secp256k1_keypair_xonly_tweak_add(CTX, &keypair, sk) == 0) || (secp256k1_keypair_xonly_tweak_add(CTX, &keypair_tmp, tweak) == 0)"
               );
        abort();
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
              ,0x194,
              "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, zeros96) == 1"
             );
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,400,
            "test condition failed: secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
          ,0x189,"test condition failed: _calls_to_callback == 1");
  abort();
}

Assistant:

static void test_keypair_add(void) {
    unsigned char sk[32];
    secp256k1_keypair keypair;
    unsigned char overflows[32];
    unsigned char zeros96[96] = { 0 };
    unsigned char tweak[32];
    int i;

    CHECK(sizeof(zeros96) == sizeof(keypair));
    testrand256(sk);
    testrand256(tweak);
    memset(overflows, 0xFF, 32);
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);

    CHECK(secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1);
    CHECK(secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1);
    CHECK(secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1);
    CHECK_ILLEGAL(CTX, secp256k1_keypair_xonly_tweak_add(CTX, NULL, tweak));
    CHECK_ILLEGAL(CTX, secp256k1_keypair_xonly_tweak_add(CTX, &keypair, NULL));
    /* This does not set the keypair to zeroes */
    CHECK(secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) != 0);

    /* Invalid tweak zeroes the keypair */
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_xonly_tweak_add(CTX, &keypair, overflows) == 0);
    CHECK(secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair))  == 0);

    /* A zero tweak is fine */
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    CHECK(secp256k1_keypair_xonly_tweak_add(CTX, &keypair, zeros96) == 1);

    /* Fails if the resulting keypair was (sk=0, pk=infinity) */
    for (i = 0; i < COUNT; i++) {
        secp256k1_scalar scalar_tweak;
        secp256k1_keypair keypair_tmp;
        testrand256(sk);
        CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
        memcpy(&keypair_tmp, &keypair, sizeof(keypair));
        /* Because sk may be negated before adding, we need to try with tweak =
         * sk as well as tweak = -sk. */
        secp256k1_scalar_set_b32(&scalar_tweak, sk, NULL);
        secp256k1_scalar_negate(&scalar_tweak, &scalar_tweak);
        secp256k1_scalar_get_b32(tweak, &scalar_tweak);
        CHECK((secp256k1_keypair_xonly_tweak_add(CTX, &keypair, sk) == 0)
              || (secp256k1_keypair_xonly_tweak_add(CTX, &keypair_tmp, tweak) == 0));
        CHECK(secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair)) == 0
              || secp256k1_memcmp_var(&keypair_tmp, zeros96, sizeof(keypair_tmp)) == 0);
    }

    /* Invalid keypair with a valid tweak */
    memset(&keypair, 0, sizeof(keypair));
    testrand256(tweak);
    CHECK_ILLEGAL(CTX, secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak));
    CHECK(secp256k1_memcmp_var(&keypair, zeros96, sizeof(keypair))  == 0);
    /* Only seckey part of keypair invalid */
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    memset(&keypair, 0, 32);
    CHECK_ILLEGAL(CTX, secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak));
    /* Only pubkey part of keypair invalid */
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    memset(&keypair.data[32], 0, 64);
    CHECK_ILLEGAL(CTX, secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak));

    /* Check that the keypair_tweak_add implementation is correct */
    CHECK(secp256k1_keypair_create(CTX, &keypair, sk) == 1);
    for (i = 0; i < COUNT; i++) {
        secp256k1_xonly_pubkey internal_pk;
        secp256k1_xonly_pubkey output_pk;
        secp256k1_pubkey output_pk_xy;
        secp256k1_pubkey output_pk_expected;
        unsigned char pk32[32];
        unsigned char sk32[32];
        int pk_parity;

        testrand256(tweak);
        CHECK(secp256k1_keypair_xonly_pub(CTX, &internal_pk, NULL, &keypair) == 1);
        CHECK(secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1);
        CHECK(secp256k1_keypair_xonly_pub(CTX, &output_pk, &pk_parity, &keypair) == 1);

        /* Check that it passes xonly_pubkey_tweak_add_check */
        CHECK(secp256k1_xonly_pubkey_serialize(CTX, pk32, &output_pk) == 1);
        CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, pk32, pk_parity, &internal_pk, tweak) == 1);

        /* Check that the resulting pubkey matches xonly_pubkey_tweak_add */
        CHECK(secp256k1_keypair_pub(CTX, &output_pk_xy, &keypair) == 1);
        CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &output_pk_expected, &internal_pk, tweak) == 1);
        CHECK(secp256k1_memcmp_var(&output_pk_xy, &output_pk_expected, sizeof(output_pk_xy)) == 0);

        /* Check that the secret key in the keypair is tweaked correctly */
        CHECK(secp256k1_keypair_sec(CTX, sk32, &keypair) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &output_pk_expected, sk32) == 1);
        CHECK(secp256k1_memcmp_var(&output_pk_xy, &output_pk_expected, sizeof(output_pk_xy)) == 0);
    }
}